

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<vec<int>>::vec<vec<int>>(vec<vec<int>> *this,vec<vec<int>_> *other)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = other->sz;
  *(uint *)this = uVar1;
  *(uint *)(this + 4) = uVar1;
  pvVar2 = malloc((ulong)uVar1 << 4);
  *(void **)(this + 8) = pvVar2;
  if ((ulong)uVar1 != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      vec<int>::vec<int>((vec<int> *)(*(long *)(this + 8) + lVar4),
                         (vec<int> *)((long)&other->data->sz + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < *(uint *)this);
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}